

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O1

void __thiscall Console::Prompt::Private::handleResize(Private *this,usize newWidth)

{
  usize *puVar1;
  String local_38;
  
  promptClear(this);
  this->stdoutScreenWidth = newWidth;
  local_38.data = &String::emptyData.super_Data;
  promptWrite(this,0,&local_38);
  if ((local_38.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_38.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_38.data != (Data *)0x0)) {
      operator_delete__(local_38.data);
    }
  }
  return;
}

Assistant:

void handleResize(usize newWidth)
  {
    promptClear();
    stdoutScreenWidth = newWidth;
    promptWrite();
  }